

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsumption_graph.hh
# Opt level: O0

void __thiscall
tchecker::graph::subsumption::
graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
::~graph_t(graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
           *this)

{
  graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
  *this_local;
  
  this->_vptr_graph_t = (_func_int **)&PTR__graph_t_004804e8;
  clear(this);
  edge_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::~edge_pool_allocator_t(&this->_edge_pool);
  node_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::~node_pool_allocator_t(&this->_node_pool);
  cover::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_le_t>
  ::~graph_t(&this->_cover_graph);
  node_sptr_le_t::~node_sptr_le_t(&this->_node_sptr_le);
  return;
}

Assistant:

virtual ~graph_t() { clear(); }